

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O0

bool QDockWidgetLayout::wmSupportsNativeWindowDeco(void)

{
  byte bVar1;
  int iVar2;
  long in_FS_OFFSET;
  QLatin1StringView QVar3;
  undefined4 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa4;
  undefined1 in_stack_ffffffffffffffa5;
  undefined1 in_stack_ffffffffffffffa6;
  byte in_stack_ffffffffffffffa7;
  char *in_stack_ffffffffffffffa8;
  undefined1 local_38 [24];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (wmSupportsNativeWindowDeco()::xcb == '\0') {
    iVar2 = __cxa_guard_acquire(&wmSupportsNativeWindowDeco()::xcb);
    if (iVar2 != 0) {
      QGuiApplication::platformName();
      QVar3 = Qt::Literals::StringLiterals::operator____L1
                        (in_stack_ffffffffffffffa8,
                         CONCAT17(in_stack_ffffffffffffffa7,
                                  CONCAT16(in_stack_ffffffffffffffa6,
                                           CONCAT15(in_stack_ffffffffffffffa5,
                                                    CONCAT14(in_stack_ffffffffffffffa4,
                                                             in_stack_ffffffffffffffa0)))));
      iVar2 = QString::compare((QLatin1String *)local_20,(CaseSensitivity)QVar3.m_size);
      in_stack_ffffffffffffffa7 = iVar2 != 0 ^ 0xff;
      QString::~QString((QString *)0x58a671);
      wmSupportsNativeWindowDeco::xcb = (bool)(in_stack_ffffffffffffffa7 & 1);
      __cxa_guard_release(&wmSupportsNativeWindowDeco()::xcb);
    }
  }
  if (wmSupportsNativeWindowDeco()::wayland == '\0') {
    iVar2 = __cxa_guard_acquire(&wmSupportsNativeWindowDeco()::wayland);
    if (iVar2 != 0) {
      QGuiApplication::platformName();
      QVar3 = Qt::Literals::StringLiterals::operator____L1
                        (in_stack_ffffffffffffffa8,
                         CONCAT17(in_stack_ffffffffffffffa7,
                                  CONCAT16(in_stack_ffffffffffffffa6,
                                           CONCAT15(in_stack_ffffffffffffffa5,
                                                    CONCAT14(in_stack_ffffffffffffffa4,
                                                             in_stack_ffffffffffffffa0)))));
      bVar1 = QString::startsWith((QLatin1String *)local_38,(CaseSensitivity)QVar3.m_size);
      QString::~QString((QString *)0x58a6ec);
      wmSupportsNativeWindowDeco::wayland = (bool)(bVar1 & 1);
      __cxa_guard_release(&wmSupportsNativeWindowDeco()::wayland);
    }
  }
  bVar1 = 1;
  if ((wmSupportsNativeWindowDeco::xcb & 1U) == 0) {
    bVar1 = wmSupportsNativeWindowDeco::wayland;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)((bVar1 ^ 1) & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QDockWidgetLayout::wmSupportsNativeWindowDeco()
{
#if defined(Q_OS_ANDROID)
    return false;
#else
    static const bool xcb = !QGuiApplication::platformName().compare("xcb"_L1, Qt::CaseInsensitive);
    static const bool wayland =
            QGuiApplication::platformName().startsWith("wayland"_L1, Qt::CaseInsensitive);
    return !(xcb || wayland);
#endif
}